

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall ManyDoublesWriteTest::ManyDoublesWriteTest(ManyDoublesWriteTest *this)

{
  ManyDoublesWriteTest *this_local;
  
  ThreadedTest::ThreadedTest(&this->super_ThreadedTest);
  (this->super_ThreadedTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ManyDoublesWriteTest_001a80d8;
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      if (is_infinity_or_nan(bits))
        continue;

      WriteDoubleHex(buffer, sizeof(buffer), bits);

      char* endptr;
      double them_double = strtod(buffer, &endptr);
      uint64_t them_bits = bit_cast<uint64_t>(them_double);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }